

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (instance *this,type_info *find_type,bool throw_if_missing)

{
  bool bVar1;
  value_and_holder *pvVar2;
  byte in_CL;
  type_info *in_RDX;
  instance *in_RSI;
  value_and_holder *in_RDI;
  iterator it;
  values_and_holders vhs;
  instance *in_stack_fffffffffffffe88;
  value_and_holder *__lhs;
  PyTypeObject *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  type_info *in_stack_fffffffffffffed8;
  values_and_holders *in_stack_fffffffffffffee0;
  iterator local_88;
  iterator local_58;
  byte local_11;
  
  local_11 = in_CL & 1;
  if ((in_RDX == (type_info *)0x0) || ((in_RSI->ob_base).ob_type == in_RDX->type)) {
    value_and_holder::value_and_holder(in_RDI,in_RSI,in_RDX,0,0);
    __lhs = in_RDI;
  }
  else {
    __lhs = in_RDI;
    values_and_holders::values_and_holders((values_and_holders *)in_RDI,in_stack_fffffffffffffe88);
    values_and_holders::find(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    values_and_holders::end((values_and_holders *)in_RDI);
    bVar1 = values_and_holders::iterator::operator!=(&local_58,&local_88);
    if (bVar1) {
      pvVar2 = values_and_holders::iterator::operator*(&local_58);
      in_RDI->inst = pvVar2->inst;
      in_RDI->index = pvVar2->index;
      in_RDI->type = pvVar2->type;
      in_RDI->vh = pvVar2->vh;
    }
    else {
      if ((local_11 & 1) != 0) {
        get_fully_qualified_tp_name_abi_cxx11_(in_stack_fffffffffffffeb8);
        std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)in_RDI);
        get_fully_qualified_tp_name_abi_cxx11_(in_stack_fffffffffffffeb8);
        std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)in_RDI);
        pybind11_fail((string *)in_RSI);
      }
      memset(in_RDI,0,0x20);
      value_and_holder::value_and_holder(in_RDI);
    }
  }
  return __lhs;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            get_fully_qualified_tp_name(find_type->type) + "' is not a pybind11 base of the given `" +
            get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#endif
}